

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O3

void __thiscall OmegaOP::algoUNIMODAL(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  long lVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  double **ppdVar5;
  ulong uVar6;
  uint u;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  uint local_64;
  Costs cost;
  uint local_5c;
  uint local_58;
  uint local_54;
  double local_50;
  ulong local_48;
  void *local_40;
  double local_38;
  
  uVar7 = (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_48 = uVar7 >> 3;
  uVar9 = (ulong)this->nbStates;
  Costs::Costs(&cost);
  pvVar3 = operator_new__(uVar9 * 8);
  if (uVar9 != 0) {
    uVar8 = 0;
    do {
      pvVar4 = operator_new__(uVar7 >> 1 & 0x3fffffffc);
      *(void **)((long)pvVar3 + uVar8 * 8) = pvVar4;
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  ppdVar5 = preprocessing(this,data);
  this->S12P = ppdVar5;
  uVar2 = (int)local_48 + 1;
  local_48 = (ulong)uVar2;
  local_64 = 2;
  pvVar4 = pvVar3;
  if (2 < uVar2) {
    do {
      local_40 = pvVar4;
      if (uVar9 != 0) {
        uVar7 = 0;
        do {
          local_5c = 1;
          local_54 = 0;
          local_50 = INFINITY;
          local_58 = 0;
          if (1 < local_64) {
            uVar8 = 0;
            local_58 = 0;
            local_54 = 0;
            local_50 = INFINITY;
            do {
              do {
                uVar6 = (ulong)local_5c;
                if ((uVar7 <= uVar8) ||
                   (*(int *)(*(long *)((long)local_40 + uVar8 * 8) + uVar6 * 4) != -1)) {
                  local_38 = this->Q[uVar8][uVar6];
                  ppdVar5 = this->S12P;
                  uVar10 = (ulong)local_64;
                  dVar11 = Costs::slopeCost(&cost,this->states + uVar8,this->states + uVar7,
                                            &local_5c,&local_64,*ppdVar5 + uVar6,*ppdVar5 + uVar10,
                                            ppdVar5[1] + uVar6,ppdVar5[1] + uVar10,
                                            ppdVar5[2] + uVar6,ppdVar5[2] + uVar10);
                  dVar11 = dVar11 + local_38 + this->penalty;
                  if (dVar11 < local_50) {
                    local_54 = local_5c;
                    local_58 = (uint)uVar8;
                    local_50 = dVar11;
                  }
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 != uVar9);
              local_5c = local_5c + 1;
              uVar8 = 0;
            } while (local_5c < local_64);
          }
          this->Q[uVar7][local_64] = local_50;
          this->lastIndState[uVar7][local_64] = local_58;
          this->lastChpt[uVar7][local_64] = local_54;
          uVar8 = (ulong)local_58;
          if (uVar7 < uVar8) {
            *(undefined4 *)(*(long *)((long)local_40 + uVar7 * 8) + (ulong)local_64 * 4) =
                 0xffffffff;
          }
          if (uVar8 < uVar7) {
            *(undefined4 *)(*(long *)((long)local_40 + uVar7 * 8) + (ulong)local_64 * 4) = 1;
          }
          if ((uVar7 == uVar8) &&
             (lVar1 = *(long *)((long)local_40 + uVar7 * 8),
             *(int *)(lVar1 + (long)(int)local_54 * 4) == -1)) {
            *(undefined4 *)(lVar1 + (ulong)local_64 * 4) = 0xffffffff;
          }
          uVar7 = uVar7 + 1;
          pvVar3 = local_40;
        } while (uVar7 != uVar9);
      }
      local_64 = local_64 + 1;
      pvVar4 = local_40;
    } while (local_64 < (uint)local_48);
  }
  this->pruning = 1.0;
  if (uVar9 != 0) {
    uVar7 = 0;
    do {
      operator_delete(*(void **)((long)pvVar3 + uVar7 * 8));
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  operator_delete__(pvVar3);
  return;
}

Assistant:

void OmegaOP::algoUNIMODAL(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  int** SLOPE = new int*[p];
  for(unsigned int i = 0; i < p; i++){SLOPE[i] = new int[n];}

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          if(!(u < v && SLOPE[u][t] == -1))
          {
            temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
        }

      }
      /////
      ///// Write response
      /////
      Q[v][T] = temp_Q;
      lastIndState[v][T] = temp_indState;
      lastChpt[v][T] = temp_chpt;

      if(temp_indState > v){SLOPE[v][T] = -1;}
      if(temp_indState < v){SLOPE[v][T] = 1;}
      if(temp_indState == v){if(SLOPE[temp_indState][temp_chpt] == -1){SLOPE[v][T] = -1;}}
    }
  }

  pruning = 1;

  for(unsigned int i = 0; i < p; i++){delete(SLOPE[i]);}
  delete [] SLOPE;
  SLOPE = NULL;

}